

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

PC * __thiscall
Hpipe::Context::keep_only(PC *__return_storage_ptr__,Context *this,Vec<unsigned_int> *keep)

{
  uint *puVar1;
  uint *puVar2;
  PcMaker pm;
  
  anon_unknown_7::PcMaker::PcMaker(&pm,this);
  puVar1 = (keep->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (keep->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    anon_unknown_7::PcMaker::add
              (&pm,(this->pos).
                   super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                   super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[*puVar2],*puVar2,true);
  }
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&pm.res);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&pm.res);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::keep_only( const Vec<unsigned> &keep ) const {
    PcMaker pm( this );

    for( unsigned ind : keep )
        pm.add( pos[ ind ], ind );

    return pm.out();
}